

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O3

void __thiscall KktCheck::printSol(KktCheck *this)

{
  ostream *poVar1;
  size_t sVar2;
  pointer pdVar3;
  long *plVar4;
  ulong uVar5;
  char buff [10];
  char local_32 [10];
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Col value: ",0xb);
  pdVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    uVar5 = 0;
    do {
      sprintf(local_32,"%2.2f ",pdVar3[uVar5]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar2 = strlen(local_32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_32,sVar2);
      uVar5 = uVar5 + 1;
      pdVar3 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->colValue).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Col dual:  ",0xb);
  pdVar3 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    uVar5 = 0;
    do {
      sprintf(local_32,"%2.2f ",pdVar3[uVar5]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar2 = strlen(local_32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_32,sVar2);
      uVar5 = uVar5 + 1;
      pdVar3 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->colDual).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Row dual:  ",0xb);
  pdVar3 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar3) {
    uVar5 = 0;
    do {
      sprintf(local_32,"%2.2f ",pdVar3[uVar5]);
      *(undefined8 *)(putchar + *(long *)(std::cout + -0x18)) = 5;
      sVar2 = strlen(local_32);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_32,sVar2);
      uVar5 = uVar5 + 1;
      pdVar3 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->rowDual).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar3 >> 3));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  return;
}

Assistant:

void KktCheck::printSol() {
	char buff [10];
	cout<<endl<<"Col value: ";
	for (size_t i=0;i<colValue.size();i++) {
		sprintf(buff, "%2.2f ", colValue[i]); 
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<"Col dual:  ";
	for (size_t i=0;i<colDual.size();i++) {
		sprintf(buff, "%2.2f ", colDual[i]);
		cout<<setw(5)<<buff; 
		}  
/*	cout<<endl<<"Row value: ";
	for (i=0;i<numRow;i++) {
	  	sprintf(buff, "%2.2f ", rowValue[i]);  
	  	cout<<setw(5)<<buff;
	  	}*/
	cout<<endl<<"Row dual:  ";
	for (size_t i=0;i<rowDual.size();i++) {
		sprintf(buff, "%2.2f ", rowDual[i]);  
		cout<<setw(5)<<buff; 
		}  
	cout<<endl<<endl;
}